

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadBlif.c
# Opt level: O0

void Psr_ManReadBlifTest(void)

{
  uint uVar1;
  int iVar2;
  abctime aVar3;
  Vec_Ptr_t *p;
  Abc_Nam_t *p_00;
  abctime aVar4;
  Vec_Ptr_t *vPrs;
  abctime clk;
  
  aVar3 = Abc_Clock();
  p = Psr_ManReadBlif("c/hie/dump/1/netlist_1_out8.blif");
  if (p != (Vec_Ptr_t *)0x0) {
    uVar1 = Vec_PtrSize(p);
    printf("Finished reading %d networks. ",(ulong)uVar1);
    p_00 = Psr_ManNameMan(p);
    uVar1 = Abc_NamObjNumMax(p_00);
    printf("NameIDs = %d. ",(ulong)uVar1);
    iVar2 = Psr_ManMemory(p);
    printf("Memory = %.2f MB. ",((double)iVar2 * 1.0) / 1048576.0);
    aVar4 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar4 - aVar3);
    Psr_ManWriteBlif("c/hie/dump/1/netlist_1_out8_out.blif",p);
    Psr_ManVecFree(p);
  }
  return;
}

Assistant:

void Psr_ManReadBlifTest()
{
    abctime clk = Abc_Clock();
    extern void Psr_ManWriteBlif( char * pFileName, Vec_Ptr_t * vPrs );
//    Vec_Ptr_t * vPrs = Psr_ManReadBlif( "aga/ray/ray_hie_oper.blif" );
    Vec_Ptr_t * vPrs = Psr_ManReadBlif( "c/hie/dump/1/netlist_1_out8.blif" );
    if ( !vPrs ) return;
    printf( "Finished reading %d networks. ", Vec_PtrSize(vPrs) );
    printf( "NameIDs = %d. ", Abc_NamObjNumMax(Psr_ManNameMan(vPrs)) );
    printf( "Memory = %.2f MB. ", 1.0*Psr_ManMemory(vPrs)/(1<<20) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    Abc_NamPrint( p->pStrs );
    Psr_ManWriteBlif( "c/hie/dump/1/netlist_1_out8_out.blif", vPrs );
    Psr_ManVecFree( vPrs );
}